

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::MultiNode
          (MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this,
          MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *other)

{
  CacheInfo *this_00;
  CacheInfo *pCVar1;
  CacheInfo *pCVar2;
  
  this->key = other->key;
  pCVar2 = (CacheInfo *)&this->value;
  for (pCVar1 = (CacheInfo *)&other->value; pCVar1 = *(CacheInfo **)pCVar1,
      pCVar1 != (CacheInfo *)0x0; pCVar1 = pCVar1 + 1) {
    this_00 = (CacheInfo *)operator_new(0x38);
    QOpenGL2GradientCache::CacheInfo::CacheInfo(this_00,pCVar1);
    *(undefined8 *)(this_00 + 1) = 0;
    *(CacheInfo **)pCVar2 = this_00;
    pCVar2 = this_00 + 1;
  }
  return;
}

Assistant:

MultiNode(const MultiNode &other)
        : key(other.key)
    {
        Chain *c = other.value;
        Chain **e = &value;
        while (c) {
            Chain *chain = new Chain{ c->value, nullptr };
            *e = chain;
            e = &chain->next;
            c = c->next;
        }
    }